

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int pull_psbt_input(uchar **cursor,size_t *max,uint32_t flags,wally_psbt_input *result)

{
  wally_tx_witness_stack *stack;
  size_t *psVar1;
  size_t *psVar2;
  _Bool _Var3;
  uint32_t uVar4;
  int iVar5;
  uint64_t uVar6;
  uint64_t len;
  uchar *puVar7;
  size_t key_len_00;
  uint64_t id_len;
  uint64_t witness_len;
  size_t i;
  uint64_t num_witnesses;
  size_t nonce_len;
  size_t value_len;
  size_t asset_len;
  uchar *nonce;
  uchar *value;
  uchar *asset;
  uchar *script;
  uint64_t script_len;
  uint64_t amount;
  size_t val_max;
  uchar *val;
  uchar *key;
  uchar *vl_p;
  uchar *pre_key;
  size_t vl_len;
  size_t key_len;
  wally_psbt_input *pwStack_38;
  int ret;
  wally_psbt_input *result_local;
  size_t *psStack_28;
  uint32_t flags_local;
  size_t *max_local;
  uchar **cursor_local;
  
  vl_p = *cursor;
  pwStack_38 = result;
  result_local._4_4_ = flags;
  psStack_28 = max;
  max_local = (size_t *)cursor;
  do {
    vl_len = pull_varlength((uchar **)max_local,psStack_28);
    if (vl_len == 0) {
      return 0;
    }
    pull_subfield_start((uchar **)max_local,psStack_28,vl_len,&val,&vl_len);
    uVar6 = pull_varint(&val,&vl_len);
    if (uVar6 == 0) {
      if (pwStack_38->utxo != (wally_tx *)0x0) {
        return -2;
      }
      subfield_nomore_end((uchar **)max_local,psStack_28,val,vl_len);
      psVar2 = max_local;
      psVar1 = psStack_28;
      uVar6 = pull_varint((uchar **)max_local,psStack_28);
      pull_subfield_start((uchar **)psVar2,psVar1,uVar6,(uchar **)&val_max,&amount);
      key_len._4_4_ =
           wally_tx_from_bytes((uchar *)val_max,amount,result_local._4_4_,&pwStack_38->utxo);
      if (key_len._4_4_ != 0) {
        return key_len._4_4_;
      }
      pull_subfield_end((uchar **)max_local,psStack_28,(uchar *)val_max,amount);
    }
    else if (uVar6 == 1) {
      if (pwStack_38->witness_utxo != (wally_tx_output *)0x0) {
        return -2;
      }
      subfield_nomore_end((uchar **)max_local,psStack_28,val,vl_len);
      psVar2 = max_local;
      psVar1 = psStack_28;
      uVar6 = pull_varint((uchar **)max_local,psStack_28);
      pull_subfield_start((uchar **)psVar2,psVar1,uVar6,(uchar **)&val_max,&amount);
      if ((result_local._4_4_ & 2) == 0) {
        script_len = pull_le64((uchar **)&val_max,&amount);
        script = (uchar *)pull_varint((uchar **)&val_max,&amount);
        asset = pull_skip((uchar **)&val_max,&amount,(size_t)script);
        if ((asset == (uchar *)0x0) || (script == (uchar *)0x0)) {
          return -2;
        }
        key_len._4_4_ =
             wally_tx_output_init_alloc(script_len,asset,(size_t)script,&pwStack_38->witness_utxo);
        if (key_len._4_4_ != 0) {
          return key_len._4_4_;
        }
        subfield_nomore_end((uchar **)max_local,psStack_28,(uchar *)val_max,amount);
      }
      else {
        key_len._4_4_ = pull_confidential_asset((uchar **)&val_max,&amount,&value,&value_len);
        if (key_len._4_4_ != 0) {
          return key_len._4_4_;
        }
        key_len._4_4_ = pull_confidential_value((uchar **)&val_max,&amount,&nonce,&nonce_len);
        if (key_len._4_4_ != 0) {
          return key_len._4_4_;
        }
        key_len._4_4_ = pull_nonce((uchar **)&val_max,&amount,(uchar **)&asset_len,&num_witnesses);
        if (key_len._4_4_ != 0) {
          return key_len._4_4_;
        }
        script = (uchar *)pull_varint((uchar **)&val_max,&amount);
        asset = pull_skip((uchar **)&val_max,&amount,(size_t)script);
        if ((asset == (uchar *)0x0) || (script == (uchar *)0x0)) {
          return -2;
        }
        key_len._4_4_ =
             wally_tx_elements_output_init_alloc
                       (asset,(size_t)script,value,value_len,nonce,nonce_len,(uchar *)asset_len,
                        num_witnesses,(uchar *)0x0,0,(uchar *)0x0,0,&pwStack_38->witness_utxo);
        if (key_len._4_4_ != 0) {
          return key_len._4_4_;
        }
        subfield_nomore_end((uchar **)max_local,psStack_28,(uchar *)val_max,amount);
      }
    }
    else if (uVar6 == 2) {
      iVar5 = pull_map((uchar **)max_local,psStack_28,val,vl_len,&pwStack_38->signatures,
                       wally_ec_public_key_verify);
      if (iVar5 != 0) {
        return iVar5;
      }
      key_len._4_4_ = 0;
    }
    else if (uVar6 == 3) {
      if (pwStack_38->sighash != 0) {
        return -2;
      }
      subfield_nomore_end((uchar **)max_local,psStack_28,val,vl_len);
      psVar2 = max_local;
      psVar1 = psStack_28;
      uVar6 = pull_varint((uchar **)max_local,psStack_28);
      pull_subfield_start((uchar **)psVar2,psVar1,uVar6,(uchar **)&val_max,&amount);
      uVar4 = pull_le32((uchar **)&val_max,&amount);
      pwStack_38->sighash = uVar4;
      subfield_nomore_end((uchar **)max_local,psStack_28,(uchar *)val_max,amount);
    }
    else if (uVar6 == 4) {
      if (pwStack_38->redeem_script != (uchar *)0x0) {
        return -2;
      }
      subfield_nomore_end((uchar **)max_local,psStack_28,val,vl_len);
      fetch_varlength_ptr(&key,(size_t *)&pre_key,(uchar **)max_local,psStack_28);
      if (pre_key == (uchar *)0x0) {
        puVar7 = (uchar *)wally_malloc(1);
        pwStack_38->redeem_script = puVar7;
      }
      else {
        iVar5 = wally_psbt_input_set_redeem_script(pwStack_38,key,(size_t)pre_key);
        if (iVar5 != 0) {
          return iVar5;
        }
        key_len._4_4_ = 0;
      }
    }
    else if (uVar6 == 5) {
      if (pwStack_38->witness_script != (uchar *)0x0) {
        return -2;
      }
      subfield_nomore_end((uchar **)max_local,psStack_28,val,vl_len);
      fetch_varlength_ptr(&key,(size_t *)&pre_key,(uchar **)max_local,psStack_28);
      if (pre_key == (uchar *)0x0) {
        puVar7 = (uchar *)wally_malloc(1);
        pwStack_38->witness_script = puVar7;
      }
      else {
        iVar5 = wally_psbt_input_set_witness_script(pwStack_38,key,(size_t)pre_key);
        if (iVar5 != 0) {
          return iVar5;
        }
        key_len._4_4_ = 0;
      }
    }
    else if (uVar6 == 6) {
      iVar5 = pull_map((uchar **)max_local,psStack_28,val,vl_len,&pwStack_38->keypaths,
                       wally_ec_public_key_verify);
      if (iVar5 != 0) {
        return iVar5;
      }
      key_len._4_4_ = 0;
    }
    else if (uVar6 == 7) {
      if (pwStack_38->final_scriptsig != (uchar *)0x0) {
        return -2;
      }
      subfield_nomore_end((uchar **)max_local,psStack_28,val,vl_len);
      fetch_varlength_ptr(&key,(size_t *)&pre_key,(uchar **)max_local,psStack_28);
      if (pre_key == (uchar *)0x0) {
        puVar7 = (uchar *)wally_malloc(1);
        pwStack_38->final_scriptsig = puVar7;
      }
      else {
        iVar5 = wally_psbt_input_set_final_scriptsig(pwStack_38,key,(size_t)pre_key);
        if (iVar5 != 0) {
          return iVar5;
        }
        key_len._4_4_ = 0;
      }
    }
    else if (uVar6 == 8) {
      if (pwStack_38->final_witness != (wally_tx_witness_stack *)0x0) {
        return -2;
      }
      subfield_nomore_end((uchar **)max_local,psStack_28,val,vl_len);
      psVar2 = max_local;
      psVar1 = psStack_28;
      uVar6 = pull_varint((uchar **)max_local,psStack_28);
      pull_subfield_start((uchar **)psVar2,psVar1,uVar6,(uchar **)&val_max,&amount);
      uVar6 = pull_varint((uchar **)&val_max,&amount);
      iVar5 = wally_tx_witness_stack_init_alloc(uVar6,&pwStack_38->final_witness);
      if (iVar5 != 0) {
        return iVar5;
      }
      for (witness_len = 0; key_len._4_4_ = 0, witness_len < uVar6; witness_len = witness_len + 1) {
        len = pull_varint((uchar **)&val_max,&amount);
        stack = pwStack_38->final_witness;
        puVar7 = pull_skip((uchar **)&val_max,&amount,len);
        iVar5 = wally_tx_witness_stack_set(stack,witness_len,puVar7,len);
        if (iVar5 != 0) {
          return iVar5;
        }
      }
      subfield_nomore_end((uchar **)max_local,psStack_28,(uchar *)val_max,amount);
    }
    else {
      if (uVar6 == 0xfc) {
        key_len_00 = pull_varlength(&val,&vl_len);
        _Var3 = is_elements_prefix(val,key_len_00);
        if (_Var3) {
          pull_skip(&val,&vl_len,8);
          uVar6 = pull_varint(&val,&vl_len);
          switch(uVar6) {
          case 0:
            if (pwStack_38->has_value != 0) {
              return -2;
            }
            subfield_nomore_end((uchar **)max_local,psStack_28,val,vl_len);
            psVar2 = max_local;
            psVar1 = psStack_28;
            uVar6 = pull_varint((uchar **)max_local,psStack_28);
            pull_subfield_start((uchar **)psVar2,psVar1,uVar6,(uchar **)&val_max,&amount);
            uVar6 = pull_le64((uchar **)&val_max,&amount);
            pwStack_38->value = uVar6;
            subfield_nomore_end((uchar **)max_local,psStack_28,(uchar *)val_max,amount);
            pwStack_38->has_value = 1;
            break;
          case 1:
            if (pwStack_38->vbf != (uchar *)0x0) {
              return -2;
            }
            subfield_nomore_end((uchar **)max_local,psStack_28,val,vl_len);
            fetch_varlength_ptr(&key,(size_t *)&pre_key,(uchar **)max_local,psStack_28);
            if (pre_key == (uchar *)0x0) {
              puVar7 = (uchar *)wally_malloc(1);
              pwStack_38->vbf = puVar7;
            }
            else {
              iVar5 = wally_psbt_input_set_vbf(pwStack_38,key,(size_t)pre_key);
              if (iVar5 != 0) {
                return iVar5;
              }
              key_len._4_4_ = 0;
            }
            break;
          case 2:
            if (pwStack_38->asset != (uchar *)0x0) {
              return -2;
            }
            subfield_nomore_end((uchar **)max_local,psStack_28,val,vl_len);
            fetch_varlength_ptr(&key,(size_t *)&pre_key,(uchar **)max_local,psStack_28);
            if (pre_key == (uchar *)0x0) {
              puVar7 = (uchar *)wally_malloc(1);
              pwStack_38->asset = puVar7;
            }
            else {
              iVar5 = wally_psbt_input_set_asset(pwStack_38,key,(size_t)pre_key);
              if (iVar5 != 0) {
                return iVar5;
              }
              key_len._4_4_ = 0;
            }
            break;
          case 3:
            if (pwStack_38->abf != (uchar *)0x0) {
              return -2;
            }
            subfield_nomore_end((uchar **)max_local,psStack_28,val,vl_len);
            fetch_varlength_ptr(&key,(size_t *)&pre_key,(uchar **)max_local,psStack_28);
            if (pre_key == (uchar *)0x0) {
              puVar7 = (uchar *)wally_malloc(1);
              pwStack_38->abf = puVar7;
            }
            else {
              iVar5 = wally_psbt_input_set_abf(pwStack_38,key,(size_t)pre_key);
              if (iVar5 != 0) {
                return iVar5;
              }
              key_len._4_4_ = 0;
            }
            break;
          case 4:
            if (pwStack_38->pegin_tx != (wally_tx *)0x0) {
              return -2;
            }
            subfield_nomore_end((uchar **)max_local,psStack_28,val,vl_len);
            psVar2 = max_local;
            psVar1 = psStack_28;
            uVar6 = pull_varint((uchar **)max_local,psStack_28);
            pull_subfield_start((uchar **)psVar2,psVar1,uVar6,(uchar **)&val_max,&amount);
            key_len._4_4_ =
                 wally_tx_from_bytes((uchar *)val_max,amount,result_local._4_4_,
                                     &pwStack_38->pegin_tx);
            if (key_len._4_4_ != 0) {
              return key_len._4_4_;
            }
            pull_subfield_end((uchar **)max_local,psStack_28,(uchar *)val_max,amount);
            break;
          case 5:
            if (pwStack_38->txoutproof != (uchar *)0x0) {
              return -2;
            }
            subfield_nomore_end((uchar **)max_local,psStack_28,val,vl_len);
            fetch_varlength_ptr(&key,(size_t *)&pre_key,(uchar **)max_local,psStack_28);
            if (pre_key == (uchar *)0x0) {
              puVar7 = (uchar *)wally_malloc(1);
              pwStack_38->txoutproof = puVar7;
            }
            else {
              iVar5 = wally_psbt_input_set_txoutproof(pwStack_38,key,(size_t)pre_key);
              if (iVar5 != 0) {
                return iVar5;
              }
              key_len._4_4_ = 0;
            }
            break;
          case 6:
            if (pwStack_38->genesis_blockhash != (uchar *)0x0) {
              return -2;
            }
            subfield_nomore_end((uchar **)max_local,psStack_28,val,vl_len);
            fetch_varlength_ptr(&key,(size_t *)&pre_key,(uchar **)max_local,psStack_28);
            if (pre_key == (uchar *)0x0) {
              puVar7 = (uchar *)wally_malloc(1);
              pwStack_38->genesis_blockhash = puVar7;
            }
            else {
              iVar5 = wally_psbt_input_set_genesis_blockhash(pwStack_38,key,(size_t)pre_key);
              if (iVar5 != 0) {
                return iVar5;
              }
              key_len._4_4_ = 0;
            }
            break;
          case 7:
            if (pwStack_38->claim_script != (uchar *)0x0) {
              return -2;
            }
            subfield_nomore_end((uchar **)max_local,psStack_28,val,vl_len);
            fetch_varlength_ptr(&key,(size_t *)&pre_key,(uchar **)max_local,psStack_28);
            if (pre_key == (uchar *)0x0) {
              puVar7 = (uchar *)wally_malloc(1);
              pwStack_38->claim_script = puVar7;
            }
            else {
              iVar5 = wally_psbt_input_set_claim_script(pwStack_38,key,(size_t)pre_key);
              if (iVar5 != 0) {
                return iVar5;
              }
              key_len._4_4_ = 0;
            }
            break;
          default:
            goto switchD_007229d1_default;
          }
          goto LAB_00722eca;
        }
      }
switchD_007229d1_default:
      iVar5 = pull_unknown_key_value((uchar **)max_local,psStack_28,vl_p,&pwStack_38->unknowns);
      if (iVar5 != 0) {
        return iVar5;
      }
      key_len._4_4_ = 0;
    }
LAB_00722eca:
    vl_p = (uchar *)*max_local;
  } while( true );
}

Assistant:

static int pull_psbt_input(const unsigned char **cursor, size_t *max,
                           uint32_t flags, struct wally_psbt_input *result)
{
    int ret;
    size_t key_len, vl_len;
    const unsigned char *pre_key, *vl_p;

    /* Read key value pairs */
    pre_key = *cursor;
    while ((key_len = pull_varlength(cursor, max)) != 0) {
        const unsigned char *key, *val;
        size_t val_max;

        /* Start parsing key */
        pull_subfield_start(cursor, max, key_len, &key, &key_len);

        /* Process based on type */
        switch (pull_varint(&key, &key_len)) {
        case PSBT_IN_NON_WITNESS_UTXO: {
            if (result->utxo)
                return WALLY_EINVAL;     /* We already have a non witness utxo */

            subfield_nomore_end(cursor, max, key, key_len);

            /* Start parsing the value field. */
            pull_subfield_start(cursor, max, pull_varint(cursor, max),
                                &val, &val_max);
            if ((ret = wally_tx_from_bytes(val, val_max, flags,
                                           &result->utxo)) != WALLY_OK)
                return ret;

            pull_subfield_end(cursor, max, val, val_max);
            break;
        }
        case PSBT_IN_WITNESS_UTXO: {
            uint64_t amount, script_len;
            const unsigned char *script;

            if (result->witness_utxo)
                return WALLY_EINVAL; /* Duplicate value */

            subfield_nomore_end(cursor, max, key, key_len);

            /* Start parsing the value field. */
            pull_subfield_start(cursor, max, pull_varint(cursor, max),
                                &val, &val_max);
#ifdef BUILD_ELEMENTS
            if (flags & WALLY_TX_FLAG_USE_ELEMENTS) {
                const unsigned char *asset, *value, *nonce;
                size_t asset_len, value_len, nonce_len;
                if ((ret = pull_confidential_asset(&val, &val_max, &asset, &asset_len)) != WALLY_OK)
                    return ret;
                if ((ret = pull_confidential_value(&val, &val_max, &value, &value_len)) != WALLY_OK)
                    return ret;
                if ((ret = pull_nonce(&val, &val_max, &nonce, &nonce_len)) != WALLY_OK)
                    return ret;

                script_len = pull_varint(&val, &val_max);
                script = pull_skip(&val, &val_max, script_len);
                if (!script || !script_len)
                    return WALLY_EINVAL;

                ret = wally_tx_elements_output_init_alloc(script, script_len,
                                                          asset, asset_len,
                                                          value, value_len,
                                                          nonce, nonce_len,
                                                          NULL, 0, NULL, 0,
                                                          &result->witness_utxo);
                if (ret != WALLY_OK)
                    return ret;

                subfield_nomore_end(cursor, max, val, val_max);
                break;
            }
#endif /* BUILD_ELEMENTS */

            amount = pull_le64(&val, &val_max);
            script_len = pull_varint(&val, &val_max);
            script = pull_skip(&val, &val_max, script_len);
            if (!script || !script_len)
                return WALLY_EINVAL;
            ret = wally_tx_output_init_alloc(amount, script, script_len,
                                             &result->witness_utxo);
            if (ret != WALLY_OK)
                return ret;

            subfield_nomore_end(cursor, max, val, val_max);
            break;
        }
        case PSBT_IN_PARTIAL_SIG: {
            ret = pull_map(cursor, max, key, key_len, &result->signatures,
                           wally_ec_public_key_verify);
            if (ret != WALLY_OK)
                return ret;
            break;
        }
        case PSBT_IN_SIGHASH_TYPE: {
            if (result->sighash != 0)
                return WALLY_EINVAL; /* Duplicate value */

            subfield_nomore_end(cursor, max, key, key_len);

            /* Start parsing the value field. */
            pull_subfield_start(cursor, max,
                                pull_varint(cursor, max),
                                &val, &val_max);
            result->sighash = pull_le32(&val, &val_max);
            subfield_nomore_end(cursor, max, val, val_max);
            break;
        }
        case PSBT_IN_REDEEM_SCRIPT:
            PSBT_PULL_B(input, redeem_script);
            break;
        case PSBT_IN_WITNESS_SCRIPT:
            PSBT_PULL_B(input, witness_script);
            break;
        case PSBT_IN_BIP32_DERIVATION:
            if ((ret = pull_map(cursor, max, key, key_len, &result->keypaths,
                                wally_ec_public_key_verify)) != WALLY_OK)
                return ret;
            break;
        case PSBT_IN_FINAL_SCRIPTSIG:
            PSBT_PULL_B(input, final_scriptsig);
            break;
        case PSBT_IN_FINAL_SCRIPTWITNESS: {
            uint64_t num_witnesses;
            size_t i;
            if (result->final_witness)
                return WALLY_EINVAL; /* Duplicate value */
            subfield_nomore_end(cursor, max, key, key_len);

            /* Start parsing the value field. */
            pull_subfield_start(cursor, max,
                                pull_varint(cursor, max),
                                &val, &val_max);
            num_witnesses = pull_varint(&val, &val_max);
            ret = wally_tx_witness_stack_init_alloc(num_witnesses, &result->final_witness);
            if (ret != WALLY_OK)
                return ret;

            for (i = 0; i < num_witnesses; ++i) {
                uint64_t witness_len = pull_varint(&val, &val_max);
                ret = wally_tx_witness_stack_set(result->final_witness, i,
                                                 pull_skip(&val, &val_max, witness_len),
                                                 witness_len);
                if (ret != WALLY_OK)
                    return ret;
            }
            subfield_nomore_end(cursor, max, val, val_max);
            break;
        }
#ifdef BUILD_ELEMENTS
        case PSBT_PROPRIETARY_TYPE: {
            const uint64_t id_len = pull_varlength(&key, &key_len);

            if (!is_elements_prefix(key, id_len))
                goto unknown_type;

            /* Skip the elements_id prefix */
            pull_skip(&key, &key_len, sizeof(PSET_KEY_PREFIX));

            switch (pull_varint(&key, &key_len)) {
            case PSET_IN_VALUE: {
                if (result->has_value)
                    return WALLY_EINVAL; /* Duplicate value */

                subfield_nomore_end(cursor, max, key, key_len);

                /* Start parsing the value field. */
                pull_subfield_start(cursor, max, pull_varint(cursor, max),
                                    &val, &val_max);
                result->value = pull_le64(&val, &val_max);
                subfield_nomore_end(cursor, max, val, val_max);
                result->has_value = true;
                break;
            }
            case PSET_IN_VALUE_BLINDER:
                PSBT_PULL_B(input, vbf);
                break;
            case PSET_IN_ASSET:
                PSBT_PULL_B(input, asset);
                break;
            case PSET_IN_ASSET_BLINDER:
                PSBT_PULL_B(input, abf);
                break;
            case PSET_IN_PEG_IN_TX: {
                if (result->pegin_tx)
                    return WALLY_EINVAL; /* Duplicate value */

                subfield_nomore_end(cursor, max, key, key_len);

                /* Start parsing the value field. */
                pull_subfield_start(cursor, max,
                                    pull_varint(cursor, max),
                                    &val, &val_max);

                ret = wally_tx_from_bytes(val, val_max, flags, &result->pegin_tx);
                if (ret != WALLY_OK)
                    return ret;

                pull_subfield_end(cursor, max, val, val_max);
                break;
            }
            case PSET_IN_TXOUT_PROOF:
                PSBT_PULL_B(input, txoutproof);
                break;
            case PSET_IN_GENESIS_HASH:
                PSBT_PULL_B(input, genesis_blockhash);
                break;
            case PSET_IN_CLAIM_SCRIPT:
                PSBT_PULL_B(input, claim_script);
                break;
            default:
                goto unknown_type;
            }
            break;
        }
#endif /* BUILD_ELEMENTS */
        default: {
unknown_type:
            /* Unknown case without elements or for unknown proprietary types */
            ret = pull_unknown_key_value(cursor, max, pre_key, &result->unknowns);
            if (ret != WALLY_OK)
                return ret;
            break;
        }
        }
        pre_key = *cursor;
    }

    return WALLY_OK;
}